

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O1

bool __thiscall ProString::operator==(ProString *this,QLatin1String other)

{
  char16_t *pcVar1;
  undefined1 uVar2;
  CutResult CVar3;
  char16_t *pcVar4;
  long lVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  long local_30;
  long local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar1 = (this->m_string).d.ptr;
  local_28 = (long)this->m_offset;
  local_30 = (long)this->m_length;
  CVar3 = QtPrivate::QContainerImplHelper::mid((this->m_string).d.size,&local_28,&local_30);
  uVar2 = 0;
  lVar5 = local_30;
  if (CVar3 == Null) {
    lVar5 = 0;
  }
  if (lVar5 == other.m_size) {
    pcVar4 = (char16_t *)0x0;
    if (CVar3 != Null) {
      pcVar4 = pcVar1 + local_28;
    }
    QVar6.m_data = pcVar4;
    QVar6.m_size = lVar5;
    uVar2 = QtPrivate::equalStrings(other,QVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return (bool)uVar2;
}

Assistant:

bool operator==(QLatin1String other) const  { return toQStringView() == other; }